

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O1

bool __thiscall deqp::egl::MultiThreadedTest::execTest(MultiThreadedTest *this,TestThread *thread)

{
  int iVar1;
  
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  return SUB41(iVar1,0);
}

Assistant:

bool MultiThreadedTest::execTest (TestThread& thread)
{
	bool isOk = false;

	try
	{
		isOk = runThread(thread);
	}
	catch (const TestThread::TestStop&)
	{
		// Thread exited due to error in other thread
		throw;
	}
	catch (const tcu::NotSupportedError&)
	{
		// Set status of each thread
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->setStatus(TestThread::THREADSTATUS_NOT_SUPPORTED);

		// Release barriers
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			m_barrierSemaphore1.increment();
			m_barrierSemaphore2.increment();
		}

		throw;
	}
	catch(...)
	{
		// Set status of each thread
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->setStatus(TestThread::THREADSTATUS_ERROR);

		// Release barriers
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			m_barrierSemaphore1.increment();
			m_barrierSemaphore2.increment();
		}

		throw;
	}

	return isOk;
}